

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

int lj_opt_fwd_sbuf(jit_State *J,IRRef lim)

{
  ushort uVar1;
  IRIns *pIVar2;
  uint uVar3;
  
  if (J->chain[0x56] <= lim) {
    uVar1 = J->chain[0x62];
    while (uVar3 = (uint)uVar1, lim < uVar3) {
      pIVar2 = (J->cur).ir;
      if (0xffe8 < (ushort)(*(short *)((long)pIVar2 + (ulong)uVar3 * 8 + 2) - 0x1eU)) {
        return 0;
      }
      uVar1 = *(ushort *)((long)pIVar2 + (ulong)uVar3 * 8 + 6);
    }
    uVar1 = J->chain[0x61];
    while( true ) {
      uVar3 = (uint)uVar1;
      if (uVar3 <= lim) {
        return 1;
      }
      pIVar2 = (J->cur).ir;
      if (0xffe8 < (ushort)(*(short *)((long)pIVar2 + (ulong)uVar3 * 8 + 2) - 0x1eU)) break;
      uVar1 = *(ushort *)((long)pIVar2 + (ulong)uVar3 * 8 + 6);
    }
  }
  return 0;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_sbuf(jit_State *J, IRRef lim)
{
  IRRef ref;
  if (J->chain[IR_BUFPUT] > lim)
    return 0;  /* Conflict. */
  ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op2 >= IRCALL_lj_strfmt_putint && ir->op2 < IRCALL_lj_buf_tostr)
      return 0;  /* Conflict. */
    ref = ir->prev;
  }
  ref = J->chain[IR_CALLL];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op2 >= IRCALL_lj_strfmt_putint && ir->op2 < IRCALL_lj_buf_tostr)
      return 0;  /* Conflict. */
    ref = ir->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}